

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDM.cpp
# Opt level: O2

int WaitNsMDM(int n)

{
  int iVar1;
  
  iVar1 = 1;
  if ((bExit == 0) && (AcousticCommandMDM != 0)) {
    iVar1 = n + 1;
    while (iVar1 = iVar1 + -1, iVar1 != 0) {
      mSleep(1000);
      if (bExit != 0) {
        return 1;
      }
      if (AcousticCommandMDM == 0) {
        return 1;
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

inline int WaitNsMDM(int n)
{
	int i = n;

	if (bExit||!AcousticCommandMDM) return EXIT_FAILURE;
	while (i)
	{
		mSleep(1000);
		if (bExit||!AcousticCommandMDM) return EXIT_FAILURE;
		i--;
	}

	return EXIT_SUCCESS;
}